

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::ByteArray::ByteArray(ByteArray *this,char *value,size_t n)

{
  char *in_RDX;
  char *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  string s;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x2f8749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_10,(ulong)local_18,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::vector<char,std::allocator<char>>::
  assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (in_RDI,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )local_18,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_10);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

ByteArray::ByteArray(const char* value, std::size_t n)
{
    const std::string s(value, n);
    m_data.assign(s.begin(), s.end());
}